

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::SingleArena_CopyConstructLong_Test::TestBody
          (SingleArena_CopyConstructLong_Test *this)

{
  pointer *__ptr;
  char *message;
  string_view value;
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  AssertionResult gtest_ar;
  ArenaStringPtr field;
  ArenaStringPtr dst;
  string empty;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined1 local_60 [16];
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  TaggedStringPtr local_40;
  ArenaStringPtr local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  local_28 = 0;
  local_20 = 0;
  local_30 = &local_20;
  SingleArena::GetArena((SingleArena *)local_60);
  local_40.ptr_ = &local_30;
  value._M_str = "A string long enough to not be inlined";
  value._M_len = 0x26;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)&local_40,value,(Arena *)0x0);
  local_38.tagged_ptr_.ptr_ = (TaggedStringPtr)(TaggedStringPtr)local_40.ptr_;
  if (((ulong)local_40.ptr_ & 3) != 0) {
    local_38.tagged_ptr_ =
         protobuf::internal::TaggedStringPtr::ForceCopy(&local_40,(Arena *)local_60._0_8_);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[39]>
            (local_50,"dst.Get()","\"A string long enough to not be inlined\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_38.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
             (char (*) [39])"A string long enough to not be inlined");
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_60 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0xca,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_60 + 8),(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 8));
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_68._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  if ((tuple<google::protobuf::Arena_*,_std::default_delete<google::protobuf::Arena>_>)
      local_60._0_8_ == (_Head_base<0UL,_google::protobuf::Arena_*,_false>)0x0) {
    protobuf::internal::ArenaStringPtr::Destroy(&local_38);
  }
  protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_40);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *)
              local_60);
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
  }
  return;
}

Assistant:

TEST_P(SingleArena, CopyConstructLong) {
  std::string empty;
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitExternal(&empty);
  field.Set("A string long enough to not be inlined", nullptr);

  ArenaStringPtr dst(arena.get(), field);
  EXPECT_EQ(dst.Get(), "A string long enough to not be inlined");
  if (arena == nullptr) dst.Destroy();
  field.Destroy();
}